

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  pointer pSVar2;
  pointer poVar3;
  size_t sVar4;
  bool bVar5;
  size_type __n;
  long lVar6;
  KeyValue<supermap::Key<4UL>,_unsigned_long> *pKVar7;
  KeyValue<supermap::Key<4UL>,_unsigned_long> *pKVar8;
  uint i;
  long lVar9;
  long lVar10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  bool hasMin;
  size_t min;
  unsigned_long batchSize_local;
  vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  writeBuffer;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type local_c0;
  ulong local_b0;
  anon_class_24_3_7a9e0d2b updateOnce;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  shared_ptr<supermap::io::FileManager> local_68;
  KeyValue<supermap::Key<4UL>,_unsigned_long> minItem;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  
  batchSize_local = batchSize;
  std::filesystem::__cxx11::path::path((path *)&currentFrontPointers,dataFileName,auto_format);
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (_Manager_type)0x0;
  local_c0 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_d8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_d8._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_c8 = p_Var1;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (&this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
             ,(path *)&currentFrontPointers,&local_68,(InnerRegisterSupplier *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&currentFrontPointers);
  (this->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  ).super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  .super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_001f6980;
  (this->super_Findable<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::Key<4UL>_>)
  ._vptr_Findable = (_func_int **)&DAT_001f69c8;
  __n = ((long)(newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(newer->
              super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&currentFrontPointers,__n,(allocator_type *)&frontLine);
  updateOnce.frontLine =
       (vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
        *)((ulong)updateOnce.frontLine & 0xffffffffffffff00);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  ::vector(&frontLine,__n,(value_type *)&updateOnce,(allocator_type *)&writeBuffer);
  lVar10 = 0x10;
  lVar14 = 0;
  lVar9 = 0;
  sVar12 = __n;
  while (bVar15 = sVar12 != 0, sVar12 = sVar12 - 1, bVar15) {
    pSVar2 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (**(code **)(*(long *)((long)&(pSVar2->
                                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                          ).
                                          super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                          .
                                          super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                          ._vptr_OrderedStorage + lVar14) + 8))
                      ((long)&(pSVar2->
                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                              ).
                              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                              .
                              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                              ._vptr_OrderedStorage + lVar14);
    poVar3 = frontLine.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar6 != 0) {
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar16 = (**(code **)(*(long *)((long)&(pSVar2->
                                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                              ).
                                              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                              ._vptr_OrderedStorage + lVar14) + 0x20))
                          ((long)&(pSVar2->
                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                  ).
                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                  .
                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                  ._vptr_OrderedStorage + lVar14,0);
      if (*(char *)((long)&(poVar3->
                           super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                           ._M_payload + lVar10) == '\x01') {
        *(undefined1 *)
         ((long)&(poVar3->
                 super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                 ._M_payload + lVar10) = 0;
      }
      *(long *)((long)poVar3 + lVar10 + -0x10) = auVar16._0_8_;
      *(long *)((long)poVar3 + lVar10 + -8) = auVar16._8_8_;
      *(undefined1 *)
       ((long)&(poVar3->
               super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
               _M_payload + lVar10) = 1;
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                            ._vptr_OrderedStorage + lVar14) + 8))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                ._vptr_OrderedStorage + lVar14);
      lVar9 = lVar9 + lVar6;
    }
    lVar14 = lVar14 + 0x38;
    lVar10 = lVar10 + 0x18;
  }
  (*(this->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              .register_,lVar9);
  updateOnce.currentFrontPointers = &currentFrontPointers;
  updateOnce.frontLine = &frontLine;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updateOnce.newer = newer;
  std::
  vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ::reserve(&writeBuffer,batchSize_local);
  dropWriteBuffer.batchSize = &batchSize_local;
  local_b0 = __n & 0xffffffff;
  dropWriteBuffer.writeBuffer = &writeBuffer;
  dropWriteBuffer.this = this;
  while( true ) {
    min = 0;
    bVar15 = false;
    for (uVar13 = local_b0; i = (int)uVar13 - 1, -1 < (int)i; uVar13 = uVar13 - 1) {
      uVar11 = (ulong)i;
      sVar4 = min;
      if (frontLine.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
          _M_engaged == true) {
        sVar4 = uVar11;
        if (bVar15) {
          pKVar7 = std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11);
          pKVar8 = std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + min);
          bVar5 = std::operator<((array<unsigned_char,_4UL> *)pKVar7,
                                 (array<unsigned_char,_4UL> *)pKVar8);
          if (!bVar5) {
            pKVar7 = std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11);
            pKVar8 = std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + min);
            bVar5 = std::operator==((array<unsigned_char,_4UL> *)pKVar7,
                                    (array<unsigned_char,_4UL> *)pKVar8);
            sVar4 = min;
            if (bVar5) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,i);
            }
          }
        }
        else {
          bVar15 = true;
        }
      }
      min = sVar4;
    }
    if (!bVar15) break;
    pKVar7 = std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>::value
                       (frontLine.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + min);
    minItem.key.super_array<unsigned_char,_4UL>._M_elems =
         (pKVar7->key).super_array<unsigned_char,_4UL>;
    minItem._4_4_ = *(undefined4 *)&pKVar7->field_0x4;
    minItem.value = pKVar7->value;
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,(int32_t)min);
    std::
    vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>
              ((vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>
                *)&writeBuffer,&minItem);
    if (batchSize_local <=
        (ulong)((long)writeBuffer.
                      super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)writeBuffer.
                      super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
  std::
  _Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ::~_Vector_base(&writeBuffer.
                   super__Vector_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
                 );
  std::
  _Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  ::~_Vector_base(&frontLine.
                   super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&currentFrontPointers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }